

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  char cVar3;
  undefined8 uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  seqDef *psVar10;
  int iVar11;
  U32 UVar12;
  int *piVar13;
  BYTE *pBVar14;
  BYTE *mEnd;
  int iVar15;
  long lVar16;
  U32 UVar17;
  uint uVar18;
  int *piVar19;
  U32 UVar20;
  ulong uVar21;
  ulong uVar22;
  BYTE *litEnd;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  int *ip;
  BYTE *litEnd_1;
  BYTE *pBVar26;
  size_t ofbCandidate;
  BYTE *litLimit_w;
  size_t local_100;
  ZSTD_matchState_t *local_f8;
  U32 local_ec;
  uint local_e8;
  U32 local_e4;
  BYTE *local_e0;
  BYTE *local_d8;
  seqStore_t *local_d0;
  uint local_c4;
  int *local_c0;
  int *local_b8;
  ulong local_b0;
  uint local_a4;
  BYTE *local_a0;
  BYTE *local_98;
  int *local_90;
  BYTE *local_88;
  uint local_7c;
  U32 *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_d8 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  uVar25 = (ulong)uVar7;
  local_98 = local_d8 + uVar25;
  local_c4 = (ms->cParams).minMatch;
  if (5 < local_c4) {
    local_c4 = 6;
  }
  if (local_c4 < 5) {
    local_c4 = 4;
  }
  local_a4 = (ms->cParams).searchLog;
  local_e8 = 6;
  if (local_a4 < 6) {
    local_e8 = local_a4;
  }
  if (local_e8 < 5) {
    local_e8 = 4;
  }
  pZVar2 = ms->dictMatchState;
  local_88 = (pZVar2->window).base;
  local_50 = local_88 + (pZVar2->window).dictLimit;
  local_a0 = (pZVar2->window).nextSrc;
  iVar15 = (int)local_a0;
  piVar13 = (int *)((ulong)(((int)src - ((int)local_98 + (int)local_50)) + iVar15 == 0) + (long)src)
  ;
  local_ec = *rep;
  UVar12 = rep[1];
  ms->lazySkipping = 0;
  local_b8 = (int *)((long)src + (srcSize - 0x10));
  uVar6 = ms->nextToUpdate;
  uVar23 = (ulong)uVar6;
  uVar18 = ((int)local_b8 - (int)(local_d8 + uVar23)) + 1;
  uVar24 = 8;
  if (uVar18 < 8) {
    uVar24 = uVar18;
  }
  if (local_b8 < local_d8 + uVar23) {
    uVar24 = 0;
  }
  if (uVar6 < uVar24 + uVar6) {
    uVar9 = ms->hashSalt;
    cVar3 = (char)ms->rowHashLog;
    do {
      if (local_c4 == 5) {
        uVar21 = *(long *)(local_d8 + uVar23) * -0x30e4432345000000;
LAB_018c31ee:
        UVar20 = (U32)((uVar21 ^ uVar9) >> (0x38U - cVar3 & 0x3f));
      }
      else {
        if (local_c4 == 6) {
          uVar21 = *(long *)(local_d8 + uVar23) * -0x30e4432340650000;
          goto LAB_018c31ee;
        }
        UVar20 = (*(int *)(local_d8 + uVar23) * -0x61c8864f ^ (uint)uVar9) >> (0x18U - cVar3 & 0x1f)
        ;
      }
      ms->hashCache[(uint)uVar23 & 7] = UVar20;
      uVar23 = uVar23 + 1;
    } while (uVar24 + uVar6 != uVar23);
  }
  pBVar26 = (BYTE *)(srcSize + (long)src);
  if (piVar13 < local_b8) {
    local_7c = ((int)local_88 - iVar15) + uVar7;
    local_70 = local_88 + -(ulong)local_7c;
    local_90 = (int *)(pBVar26 + -0x20);
    iVar11 = (int)local_d8;
    local_58 = (ulong)((1 - uVar7) - iVar11);
    local_60 = (ulong)(uint)-iVar11;
    local_68 = (ulong)((((iVar15 - uVar7) - (int)local_88) - iVar11) + 1);
    local_f8 = ms;
    local_e4 = UVar12;
    local_e0 = pBVar26;
    local_d0 = seqStore;
    local_b0 = uVar25;
    local_78 = rep;
    do {
      uVar7 = local_c4;
      uVar6 = (((int)piVar13 - (int)local_d8) - local_ec) + 1;
      uVar24 = (uint)uVar25;
      piVar19 = (int *)(local_d8 + uVar6);
      if (uVar6 < uVar24) {
        piVar19 = (int *)(local_88 + (uVar6 - local_7c));
      }
      local_c0 = piVar13;
      if ((uVar6 - uVar24 < 0xfffffffd) && (*piVar19 == *(int *)((long)piVar13 + 1))) {
        pBVar14 = pBVar26;
        if (uVar6 < uVar24) {
          pBVar14 = local_a0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar13 + 5),(BYTE *)(piVar19 + 1),pBVar26,pBVar14,
                           local_98);
        uVar25 = sVar8 + 4;
      }
      else {
        uVar25 = 0;
      }
      local_100 = 999999999;
      if (uVar7 == 6) {
        if (local_e8 == 6) {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
        else if (local_e8 == 5) {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
        else {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
      }
      else if (uVar7 == 5) {
        if (local_e8 == 6) {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
        else if (local_e8 == 5) {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
        else {
          uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
        }
      }
      else if (local_e8 == 6) {
        uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
      }
      else if (local_e8 == 5) {
        uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
      }
      else {
        uVar23 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (local_f8,(BYTE *)local_c0,pBVar26,&local_100);
      }
      uVar9 = uVar25;
      if (uVar25 < uVar23) {
        uVar9 = uVar23;
      }
      if (uVar9 < 4) {
        piVar13 = (int *)((long)local_c0 + ((ulong)((long)local_c0 - (long)src) >> 8) + 1);
        local_f8->lazySkipping = (uint)(0x7ff < (ulong)((long)local_c0 - (long)src));
        uVar25 = local_b0;
        pBVar26 = local_e0;
        UVar12 = local_e4;
      }
      else {
        piVar19 = local_c0;
        uVar21 = local_100;
        if (uVar23 <= uVar25) {
          piVar19 = (int *)((long)piVar13 + 1);
          uVar21 = 1;
        }
        uVar23 = uVar9;
        if (local_c0 < local_b8) {
          iVar15 = (int)local_c0;
          local_38 = (ulong)(((int)local_58 + iVar15) - local_ec);
          local_40 = (ulong)(((int)local_60 + iVar15) - local_ec);
          local_48 = (ulong)(((int)local_68 + iVar15) - local_ec);
          lVar16 = 0;
          do {
            ip = (int *)((long)local_c0 + lVar16 + 1);
            iVar15 = (int)lVar16;
            uVar7 = (int)local_40 + iVar15 + 1;
            piVar13 = (int *)(local_d8 + uVar7);
            if (uVar7 < (uint)local_b0) {
              piVar13 = (int *)(local_88 + (uint)((int)local_48 + iVar15));
            }
            uVar23 = uVar9;
            if (((uint)((int)local_38 + iVar15) < 0xfffffffd) && (*piVar13 == *ip)) {
              pBVar26 = local_e0;
              if (uVar7 < (uint)local_b0) {
                pBVar26 = local_a0;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)local_c0 + lVar16 + 5),(BYTE *)(piVar13 + 1),
                                 local_e0,pBVar26,local_98);
              if (sVar8 < 0xfffffffffffffffc) {
                uVar7 = 0x1f;
                if ((uint)uVar21 != 0) {
                  for (; (uint)uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                if ((int)((uVar7 ^ 0x1f) + (int)uVar9 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                  uVar21 = 1;
                  piVar19 = ip;
                  uVar23 = sVar8 + 4;
                }
              }
            }
            local_100 = 999999999;
            if (local_c4 == 6) {
              if (local_e8 == 6) {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
              else if (local_e8 == 5) {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
              else {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
            }
            else if (local_c4 == 5) {
              if (local_e8 == 6) {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
              else if (local_e8 == 5) {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
              else {
                uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                                  (local_f8,(BYTE *)ip,local_e0,&local_100);
              }
            }
            else if (local_e8 == 6) {
              uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                                (local_f8,(BYTE *)ip,local_e0,&local_100);
            }
            else if (local_e8 == 5) {
              uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                                (local_f8,(BYTE *)ip,local_e0,&local_100);
            }
            else {
              uVar9 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                                (local_f8,(BYTE *)ip,local_e0,&local_100);
            }
            if (uVar9 < 4) goto LAB_018c3761;
            uVar7 = 0x1f;
            if ((uint)uVar21 != 0) {
              for (; (uint)uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            iVar15 = 0x1f;
            if ((uint)local_100 != 0) {
              for (; (uint)local_100 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            if ((int)uVar9 * 4 - iVar15 <= (int)((uVar7 ^ 0x1f) + (int)uVar23 * 4 + -0x1b))
            goto LAB_018c3761;
            lVar5 = lVar16 + 1;
            lVar16 = lVar16 + 1;
            uVar21 = local_100;
            piVar19 = ip;
          } while ((int *)((long)local_c0 + lVar5) < local_b8);
          piVar19 = (int *)((long)local_c0 + lVar16);
          uVar23 = uVar9;
        }
LAB_018c3761:
        pZVar2 = local_f8;
        if (3 < uVar21) {
          uVar25 = (long)piVar19 + (-(long)local_d8 - uVar21) + -0xfffffffd;
          pBVar14 = local_d8;
          pBVar26 = local_98;
          if ((uint)uVar25 < (uint)local_b0) {
            pBVar14 = local_70;
            pBVar26 = local_50;
          }
          if ((src < piVar19) && (uVar25 = uVar25 & 0xffffffff, pBVar26 < pBVar14 + uVar25)) {
            pBVar14 = pBVar14 + uVar25;
            do {
              piVar13 = (int *)((long)piVar19 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar13 != *pBVar14) ||
                 (uVar23 = uVar23 + 1, piVar19 = piVar13, piVar13 <= src)) break;
            } while (pBVar26 < pBVar14);
          }
          local_e4 = local_ec;
          local_ec = (U32)uVar21 - 3;
        }
        uVar9 = (long)piVar19 - (long)src;
        pBVar26 = local_d0->lit;
        if (local_90 < piVar19) {
          ZSTD_safecopyLiterals(pBVar26,(BYTE *)src,(BYTE *)piVar19,(BYTE *)local_90);
LAB_018c3828:
          local_d0->lit = local_d0->lit + uVar9;
          psVar10 = local_d0->sequences;
          if (0xffff < uVar9) {
            local_d0->longLengthType = ZSTD_llt_literalLength;
            local_d0->longLengthPos =
                 (U32)((ulong)((long)psVar10 - (long)local_d0->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar26 = *src;
          *(undefined8 *)(pBVar26 + 8) = uVar4;
          pBVar26 = local_d0->lit;
          if (0x10 < uVar9) {
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar26 + 0x18) = uVar4;
            if (0x20 < (long)uVar9) {
              lVar16 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar4 = puVar1[1];
                pBVar14 = pBVar26 + lVar16 + 0x20;
                *(undefined8 *)pBVar14 = *puVar1;
                *(undefined8 *)(pBVar14 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar14 + 0x18) = uVar4;
                lVar16 = lVar16 + 0x20;
              } while (pBVar14 + 0x20 < pBVar26 + uVar9);
            }
            goto LAB_018c3828;
          }
          local_d0->lit = pBVar26 + uVar9;
          psVar10 = local_d0->sequences;
        }
        uVar25 = local_b0;
        pBVar26 = local_e0;
        psVar10->litLength = (U16)uVar9;
        psVar10->offBase = (U32)uVar21;
        if (0xffff < uVar23 - 3) {
          local_d0->longLengthType = ZSTD_llt_matchLength;
          local_d0->longLengthPos =
               (U32)((ulong)((long)psVar10 - (long)local_d0->sequencesStart) >> 3);
        }
        psVar10->mlBase = (U16)(uVar23 - 3);
        local_d0->sequences = psVar10 + 1;
        if (pZVar2->lazySkipping != 0) {
          uVar7 = pZVar2->nextToUpdate;
          uVar9 = (ulong)uVar7;
          uVar6 = ((int)local_b8 - (int)(local_d8 + uVar9)) + 1;
          if (7 < uVar6) {
            uVar6 = 8;
          }
          if (local_b8 < local_d8 + uVar9) {
            uVar6 = 0;
          }
          if (uVar7 < uVar6 + uVar7) {
            UVar12 = pZVar2->rowHashLog;
            uVar21 = pZVar2->hashSalt;
            iVar15 = 0x18 - UVar12;
            local_c0 = (int *)CONCAT44(local_c0._4_4_,iVar15);
            do {
              if (local_c4 == 5) {
                uVar22 = *(long *)(local_d8 + uVar9) * -0x30e4432345000000;
LAB_018c399e:
                UVar20 = (U32)((uVar22 ^ uVar21) >> (0x38U - (char)UVar12 & 0x3f));
              }
              else {
                if (local_c4 == 6) {
                  uVar22 = *(long *)(local_d8 + uVar9) * -0x30e4432340650000;
                  goto LAB_018c399e;
                }
                UVar20 = (*(int *)(local_d8 + uVar9) * -0x61c8864f ^ (uint)uVar21) >>
                         ((byte)iVar15 & 0x1f);
              }
              pZVar2->hashCache[(uint)uVar9 & 7] = UVar20;
              uVar9 = uVar9 + 1;
            } while (uVar6 + uVar7 != uVar9);
          }
          pZVar2->lazySkipping = 0;
        }
        piVar13 = (int *)((long)piVar19 + uVar23);
        src = piVar13;
        UVar12 = local_e4;
        UVar20 = local_e4;
        if (piVar13 <= local_b8) {
          do {
            UVar17 = UVar20;
            UVar20 = local_ec;
            uVar7 = ((int)piVar13 - (int)local_d8) - UVar17;
            uVar6 = (uint)uVar25;
            pBVar14 = local_d8;
            if (uVar7 < uVar6) {
              pBVar14 = local_70;
            }
            src = piVar13;
            UVar12 = UVar17;
            if ((0xfffffffc < uVar7 - uVar6) || (*(int *)(pBVar14 + uVar7) != *piVar13)) break;
            mEnd = pBVar26;
            if (uVar7 < uVar6) {
              mEnd = local_a0;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar13 + 1),(BYTE *)((long)(pBVar14 + uVar7) + 4),pBVar26,
                               mEnd,local_98);
            pBVar14 = local_d0->lit;
            if (local_90 < piVar13) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)piVar13,(BYTE *)piVar13,(BYTE *)local_90);
            }
            else {
              uVar4 = *(undefined8 *)(piVar13 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)piVar13;
              *(undefined8 *)(pBVar14 + 8) = uVar4;
            }
            psVar10 = local_d0->sequences;
            psVar10->litLength = 0;
            psVar10->offBase = 1;
            if (0xffff < sVar8 + 1) {
              local_d0->longLengthType = ZSTD_llt_matchLength;
              local_d0->longLengthPos =
                   (U32)((ulong)((long)psVar10 - (long)local_d0->sequencesStart) >> 3);
            }
            psVar10->mlBase = (U16)(sVar8 + 1);
            local_d0->sequences = psVar10 + 1;
            piVar13 = (int *)((long)piVar13 + sVar8 + 4);
            src = piVar13;
            UVar12 = UVar20;
            local_ec = UVar17;
          } while (piVar13 <= local_b8);
        }
      }
      rep = local_78;
      local_e4 = UVar12;
    } while (piVar13 < local_b8);
  }
  *rep = local_ec;
  rep[1] = UVar12;
  return (long)pBVar26 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}